

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

bool cppjieba::DecodeRunesInString(char *s,size_t len,RuneStrArray *runes)

{
  undefined1 local_4c [8];
  RuneStr x;
  RuneStrLite rp;
  uint32_t j;
  uint32_t i;
  RuneStrArray *runes_local;
  size_t len_local;
  char *s_local;
  
  limonp::LocalVector<cppjieba::RuneStr>::clear(runes);
  limonp::LocalVector<cppjieba::RuneStr>::reserve(runes,len >> 1);
  rp.len = 0;
  rp.rune = 0;
  while( true ) {
    if (len <= rp.len) {
      return true;
    }
    x._12_8_ = DecodeRuneInString(s + rp.len,len - rp.len);
    if (x.unicode_length == 0) break;
    RuneStr::RuneStr((RuneStr *)local_4c,x.unicode_offset,rp.len,x.unicode_length,rp.rune,1);
    limonp::LocalVector<cppjieba::RuneStr>::push_back(runes,(RuneStr *)local_4c);
    rp.len = x.unicode_length + rp.len;
    rp.rune = rp.rune + 1;
  }
  limonp::LocalVector<cppjieba::RuneStr>::clear(runes);
  return false;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, RuneStrArray& runes) {
  runes.clear();
  runes.reserve(len / 2);
  for (uint32_t i = 0, j = 0; i < len;) {
    RuneStrLite rp = DecodeRuneInString(s + i, len - i);
    if (rp.len == 0) {
      runes.clear();
      return false;
    }
    RuneStr x(rp.rune, i, rp.len, j, 1);
    runes.push_back(x);
    i += rp.len;
    ++j;
  }
  return true;
}